

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  HLSL2GLSLConverterImpl *pHVar1;
  bool bVar2;
  bool bVar3;
  pointer pHVar4;
  Char *pCVar5;
  pointer pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  String local_388;
  undefined1 local_368 [8];
  string err_9;
  FunctionStubHashKey local_340;
  _Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
  local_318;
  const_iterator StubIt_1;
  undefined1 local_2f0 [8];
  string err_8;
  const_iterator local_2c8;
  _Node_iterator_base<Diligent::HashMapStringKey,_false> local_2c0;
  iterator ClosingBracketToken;
  undefined1 local_298 [8];
  string err_7;
  undefined1 local_258 [8];
  string err_6;
  undefined1 local_218 [8];
  string err_5;
  undefined1 local_1f0 [4];
  int NumOpenBrackets;
  undefined1 local_1d0 [8];
  string err_4;
  FunctionStubHashKey local_1a8;
  _Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
  local_180;
  const_iterator StubIt;
  HLSLObjectInfo *pObjectInfo;
  undefined1 local_150 [8];
  string err_3;
  undefined1 local_110 [8];
  string err_2;
  _Node_iterator_base<Diligent::HashMapStringKey,_false> _Stack_e8;
  Uint32 NumArguments;
  iterator ArgsListEndToken;
  undefined1 local_c0 [8];
  string err_1;
  undefined1 local_80 [8];
  string err;
  iterator OperationToken;
  HashMapStringKey local_40;
  _Node_iterator_base<Diligent::HashMapStringKey,_false> local_30;
  const_iterator AtomicIt;
  iterator Token;
  iterator *ScopeEnd_local;
  iterator *ScopeStart_local;
  ConversionStream *this_local;
  
  AtomicIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur =
       (_Node_iterator_base<Diligent::HashMapStringKey,_false>)ScopeStart->_M_node;
  while (bVar2 = std::operator!=((_Self *)&AtomicIt,ScopeEnd), bVar2) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
    if (pHVar4->Type == Identifier) {
      pHVar1 = this->m_Converter;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      HashMapStringKey::HashMapStringKey(&local_40,pCVar5,false);
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
           ::find(&pHVar1->m_AtomicOperations,&local_40);
      HashMapStringKey::~HashMapStringKey(&local_40);
      OperationToken._M_node =
           (_List_node_base *)
           std::
           unordered_set<Diligent::HashMapStringKey,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<Diligent::HashMapStringKey>_>
           ::end(&this->m_Converter->m_AtomicOperations);
      bVar2 = std::__detail::operator==
                        (&local_30,
                         (_Node_iterator_base<Diligent::HashMapStringKey,_false> *)&OperationToken);
      if (bVar2) {
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                  ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
      }
      else {
        err.field_2._8_8_ =
             AtomicIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur;
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                  ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
        bVar2 = std::operator!=((_Self *)&AtomicIt,ScopeEnd);
        if (!bVar2) {
          FormatString<char[15]>((string *)local_80,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)((long)&err_1.field_2 + 8),this,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
          in_stack_fffffffffffffbf8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_1.field_2 + 8);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8c4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_80);
        }
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
        if (pHVar4->Type != OpenParen) {
          FormatString<char[25]>((string *)local_c0,(char (*) [25])"Open bracket is expected");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)&ArgsListEndToken,this,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
          in_stack_fffffffffffffbf8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &ArgsListEndToken;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8c5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string((string *)&ArgsListEndToken);
          std::__cxx11::string::~string((string *)local_c0);
        }
        _Stack_e8 = AtomicIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur;
        err_2.field_2._12_4_ =
             CountFunctionArguments(this,(iterator *)&stack0xffffffffffffff18,ScopeEnd);
        bVar2 = std::operator!=((_Self *)&stack0xffffffffffffff18,ScopeEnd);
        if (!bVar2) {
          FormatString<char[15]>((string *)local_110,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)((long)&err_3.field_2 + 8),this,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&stack0xffffffffffffff18,4)
          ;
          in_stack_fffffffffffffbf8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_3.field_2 + 8);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8cc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string((string *)(err_3.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_110);
        }
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                  ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
        bVar2 = std::operator!=((_Self *)&AtomicIt,ScopeEnd);
        if (!bVar2) {
          FormatString<char[15]>((string *)local_150,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)&pObjectInfo,this,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
          in_stack_fffffffffffffbf8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pObjectInfo;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessAtomics",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x8cf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_150,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string((string *)&pObjectInfo);
          std::__cxx11::string::~string((string *)local_150);
        }
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
        StubIt.
        super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                   )FindHLSLObject(this,&pHVar4->Literal);
        if (StubIt.
            super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
            ._M_cur == (__node_type *)0x0) {
          pHVar1 = this->m_Converter;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&err.field_2 + 8));
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          FunctionStubHashKey::FunctionStubHashKey
                    (&local_340,"shared_var",pCVar5,err_2.field_2._12_4_);
          local_318._M_cur =
               (__node_type *)
               std::
               unordered_map<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_Diligent::FunctionStubHashKey::Hasher,_std::equal_to<Diligent::FunctionStubHashKey>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>_>
               ::find(&pHVar1->m_GLSLStubs,&local_340);
          FunctionStubHashKey::~FunctionStubHashKey(&local_340);
          err_9.field_2._8_8_ =
               std::
               unordered_map<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_Diligent::FunctionStubHashKey::Hasher,_std::equal_to<Diligent::FunctionStubHashKey>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>_>
               ::end(&this->m_Converter->m_GLSLStubs);
          bVar2 = std::__detail::operator!=
                            (&local_318,
                             (_Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                              *)((long)&err_9.field_2 + 8));
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                               ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                                ((long)&err.field_2 + 8));
            FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                      ((string *)local_368,(Diligent *)"Unable to find function stub for function ",
                       (char (*) [43])&pHVar4->Literal,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46d8fa
                       ,(char (*) [7])((long)&err_2.field_2 + 0xc),(uint *)" arguments",
                       (char (*) [11])in_stack_fffffffffffffbf8);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_388,this,
                       (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&err.field_2 + 8),
                       4);
            in_stack_fffffffffffffbf8 = &local_388;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x909,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_368,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string((string *)&local_388);
            std::__cxx11::string::~string((string *)local_368);
          }
          pvVar6 = std::__detail::
                   _Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                   ::operator->((_Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                                 *)&local_318);
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                              ((long)&err.field_2 + 8));
          std::__cxx11::string::operator=((string *)&pHVar4->Literal,(string *)&pvVar6->second);
        }
        else {
          pHVar1 = this->m_Converter;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&err.field_2 + 8));
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          FunctionStubHashKey::FunctionStubHashKey(&local_1a8,"image",pCVar5,err_2.field_2._12_4_);
          local_180._M_cur =
               (__node_type *)
               std::
               unordered_map<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_Diligent::FunctionStubHashKey::Hasher,_std::equal_to<Diligent::FunctionStubHashKey>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>_>
               ::find(&pHVar1->m_GLSLStubs,&local_1a8);
          FunctionStubHashKey::~FunctionStubHashKey(&local_1a8);
          err_4.field_2._8_8_ =
               std::
               unordered_map<Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo,_Diligent::FunctionStubHashKey::Hasher,_std::equal_to<Diligent::FunctionStubHashKey>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>_>
               ::end(&this->m_Converter->m_GLSLStubs);
          bVar2 = std::__detail::operator!=
                            (&local_180,
                             (_Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                              *)((long)&err_4.field_2 + 8));
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                               ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                                ((long)&err.field_2 + 8));
            FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                      ((string *)local_1d0,(Diligent *)"Unable to find function stub for function ",
                       (char (*) [43])&pHVar4->Literal,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46d8fa
                       ,(char (*) [7])((long)&err_2.field_2 + 0xc),(uint *)" arguments",
                       (char (*) [11])in_stack_fffffffffffffbf8);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      ((String *)local_1f0,this,
                       (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&err.field_2 + 8),
                       4);
            in_stack_fffffffffffffbf8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8d7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1d0,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string((string *)local_1f0);
            std::__cxx11::string::~string((string *)local_1d0);
          }
          err_5.field_2._12_4_ = 1;
          while ((bVar2 = std::operator!=((_Self *)&AtomicIt,ScopeEnd),
                 bVar2 && err_5.field_2._12_4_ != 0 &&
                 ((err_5.field_2._12_4_ != 1 ||
                  ((pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                                        &AtomicIt), pHVar4->Type != Comma &&
                   (pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                                       ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                                        &AtomicIt), pHVar4->Type != ClosingParen))))))) {
            pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                               ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
            if (pHVar4->Type == OpenParen) {
              err_5.field_2._12_4_ = err_5.field_2._12_4_ + 1;
            }
            else {
              pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                                 ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
              if (pHVar4->Type == ClosingParen) {
                err_5.field_2._12_4_ = err_5.field_2._12_4_ + -1;
              }
            }
            std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                      ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          }
          bVar2 = std::operator!=((_Self *)&AtomicIt,ScopeEnd);
          if (!bVar2) {
            FormatString<char[15]>((string *)local_218,(char (*) [15])"Unexpected EOF");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      ((String *)((long)&err_6.field_2 + 8),this,
                       (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
            in_stack_fffffffffffffbf8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_6.field_2 + 8);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8ea,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_218,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string((string *)(err_6.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_218);
          }
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          if (pHVar4->Type != Comma) {
            FormatString<char[18]>((string *)local_258,(char (*) [18])"Comma is expected");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      ((String *)((long)&err_7.field_2 + 8),this,
                       (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
            in_stack_fffffffffffffbf8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_7.field_2 + 8);
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8eb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_258,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string((string *)(err_7.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_258);
          }
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          if (pHVar4->Type != ClosingSquareBracket) {
            FormatString<char[13]>((string *)local_298,(char (*) [13])"Expected \']\'");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      ((String *)&ClosingBracketToken,this,
                       (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
            in_stack_fffffffffffffbf8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ClosingBracketToken;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_298,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string((string *)&ClosingBracketToken);
            std::__cxx11::string::~string((string *)local_298);
          }
          local_2c0 = AtomicIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur;
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                    (&local_2c8,(iterator *)&local_2c0);
          err_8.field_2._8_8_ =
               std::__cxx11::
               list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
               ::erase(&this->m_Tokens,local_2c8);
          while( true ) {
            bVar3 = std::operator!=((_Self *)&AtomicIt,ScopeStart);
            bVar2 = false;
            if (bVar3) {
              pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                                 ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
              bVar2 = pHVar4->Type != OpenSquareBracket;
            }
            if (!bVar2) break;
            std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator--
                      ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          }
          bVar2 = std::operator!=((_Self *)&AtomicIt,ScopeStart);
          if (!bVar2) {
            FormatString<char[13]>((string *)local_2f0,(char (*) [13])"Expected \'[\'");
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      ((String *)&StubIt_1,this,
                       (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt,4);
            in_stack_fffffffffffffbf8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&StubIt_1;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ProcessAtomics",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x8fb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2f0,(char (*) [2])0x46b1a3,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string((string *)&StubIt_1);
            std::__cxx11::string::~string((string *)local_2f0);
          }
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          pHVar4->Type = Comma;
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
          std::__cxx11::string::operator=((string *)&pHVar4->Literal,",");
          pvVar6 = std::__detail::
                   _Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                   ::operator->((_Node_const_iterator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false,_false>
                                 *)&local_180);
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)
                              ((long)&err.field_2 + 8));
          std::__cxx11::string::operator=((string *)&pHVar4->Literal,(string *)&pvVar6->second);
        }
        AtomicIt.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur =
             (_Node_iterator_base<Diligent::HashMapStringKey,_false>)
             (_Node_iterator_base<Diligent::HashMapStringKey,_false>)_Stack_e8._M_cur;
      }
    }
    else {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++
                ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&AtomicIt);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics(const TokenListType::iterator& ScopeStart,
                                                              const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            auto AtomicIt = m_Converter.m_AtomicOperations.find(Token->Literal.c_str());
            if (AtomicIt == m_Converter.m_AtomicOperations.end())
            {
                ++Token;
                continue;
            }

            auto OperationToken = Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            // ^
            ++Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            //               ^
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenParen, "Open bracket is expected");

            auto ArgsListEndToken = Token;
            auto NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);
            // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
            //                                           ^
            //                                       ArgsListEndToken
            VERIFY_PARSER_STATE(ArgsListEndToken, ArgsListEndToken != ScopeEnd, "Unexpected EOF");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");

            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo != nullptr)
            {
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("image", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");

                // Find first comma
                int NumOpenBrackets = 1;
                while (Token != ScopeEnd && NumOpenBrackets != 0)
                {
                    // Do not count arguments of nested functions:
                    if (NumOpenBrackets == 1 && (Token->Type == TokenType::Comma || Token->Type == TokenType::ClosingParen))
                        break;

                    if (Token->Type == TokenType::OpenParen)
                        ++NumOpenBrackets;
                    else if (Token->Type == TokenType::ClosingParen)
                        --NumOpenBrackets;

                    ++Token;
                }
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                              ^
                VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Comma, "Comma is expected");

                --Token;
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                             ^
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Expected \']\'");
                auto ClosingBracketToken = Token;
                --Token;
                m_Tokens.erase(ClosingBracketToken);
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                           ^
                while (Token != ScopeStart && Token->Type != TokenType::OpenSquareBracket)
                    --Token;
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                     ^

                VERIFY_PARSER_STATE(Token, Token != ScopeStart, "Expected \'[\'");
                Token->Type    = TokenType::Comma;
                Token->Literal = ",";
                // InterlockedAdd(Tex2D,GTid.xy, 1, iOldVal);
                //                     ^

                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddImage_3(Tex2D,GTid.xy, 1, iOldVal);
            }
            else
            {
                // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("shared_var", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");
                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddSharedVar_3(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            }
            Token = ArgsListEndToken;
        }
        else
            ++Token;
    }
}